

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator::
ImmutablePrimitiveOneofFieldLiteGenerator
          (ImmutablePrimitiveOneofFieldLiteGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,int builderBitIndex,Context *context)

{
  OneofGeneratorInfo *info;
  
  ImmutablePrimitiveFieldLiteGenerator::ImmutablePrimitiveFieldLiteGenerator
            (&this->super_ImmutablePrimitiveFieldLiteGenerator,descriptor,messageBitIndex,
             builderBitIndex,context);
  (this->super_ImmutablePrimitiveFieldLiteGenerator).super_ImmutableFieldLiteGenerator.
  _vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutablePrimitiveOneofFieldLiteGenerator_00429140;
  info = Context::GetOneofGeneratorInfo(context,*(OneofDescriptor **)(descriptor + 0x60));
  SetCommonOneofVariables
            (descriptor,info,&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_);
  return;
}

Assistant:

ImmutablePrimitiveOneofFieldLiteGenerator::
ImmutablePrimitiveOneofFieldLiteGenerator(const FieldDescriptor* descriptor,
                                 int messageBitIndex,
                                 int builderBitIndex,
                                 Context* context)
    : ImmutablePrimitiveFieldLiteGenerator(
          descriptor, messageBitIndex, builderBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}